

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall
c4::basic_substring<const_char>::ends_with(basic_substring<const_char> *this,ro_substr pattern)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = pattern.len;
  if (this->len < uVar3) {
    return false;
  }
  uVar4 = 0;
  do {
    bVar5 = uVar3 == uVar4;
    if (bVar5) {
      return bVar5;
    }
    lVar2 = uVar4 + (this->len - uVar3);
    pcVar1 = pattern.str + uVar4;
    uVar4 = uVar4 + 1;
  } while (this->str[lVar2] == *pcVar1);
  return bVar5;
}

Assistant:

bool ends_with(ro_substr pattern) const
    {
        if(len < pattern.len)
        {
            return false;
        }
        for(size_t i = 0, s = len-pattern.len; i < pattern.len; ++i)
        {
            if(str[s+i] != pattern[i])
            {
                return false;
            }
        }
        return true;
    }